

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

bool FindMeshNode(Ref<glTF2::Node> *nodeIn,Ref<glTF2::Node> *meshNode,string *meshID)

{
  string *meshNode_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Node *pNVar4;
  size_type sVar5;
  reference this;
  reference nodeIn_00;
  string local_50;
  uint local_30;
  uint local_2c;
  uint i_1;
  uint i;
  string *meshID_local;
  Ref<glTF2::Node> *meshNode_local;
  Ref<glTF2::Node> *nodeIn_local;
  
  local_2c = 0;
  _i_1 = meshID;
  meshID_local = (string *)meshNode;
  meshNode_local = nodeIn;
  while( true ) {
    uVar3 = (ulong)local_2c;
    pNVar4 = glTF2::Ref<glTF2::Node>::operator->(meshNode_local);
    sVar5 = std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::size
                      (&pNVar4->meshes);
    if (sVar5 <= uVar3) {
      local_30 = 0;
      while( true ) {
        uVar3 = (ulong)local_30;
        pNVar4 = glTF2::Ref<glTF2::Node>::operator->(meshNode_local);
        sVar5 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
                size(&pNVar4->children);
        if (sVar5 <= uVar3) {
          return false;
        }
        pNVar4 = glTF2::Ref<glTF2::Node>::operator->(meshNode_local);
        nodeIn_00 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    ::operator[](&pNVar4->children,(ulong)local_30);
        meshNode_00 = meshID_local;
        std::__cxx11::string::string((string *)&local_50,(string *)meshID);
        bVar1 = FindMeshNode(nodeIn_00,(Ref<glTF2::Node> *)meshNode_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) break;
        local_30 = local_30 + 1;
      }
      return true;
    }
    pNVar4 = glTF2::Ref<glTF2::Node>::operator->(meshNode_local);
    this = std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::
           operator[](&pNVar4->meshes,(ulong)local_2c);
    glTF2::Ref<glTF2::Mesh>::operator->(this);
    iVar2 = std::__cxx11::string::compare((string *)meshID);
    if (iVar2 == 0) break;
    local_2c = local_2c + 1;
  }
  *(vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> **)meshID_local = meshNode_local->vector;
  *(uint *)&meshID_local->_M_string_length = meshNode_local->index;
  return true;
}

Assistant:

bool FindMeshNode(Ref<Node>& nodeIn, Ref<Node>& meshNode, std::string meshID)
{
    for (unsigned int i = 0; i < nodeIn->meshes.size(); ++i) {
        if (meshID.compare(nodeIn->meshes[i]->id) == 0) {
            meshNode = nodeIn;
            return true;
        }
    }

    for (unsigned int i = 0; i < nodeIn->children.size(); ++i) {
        if(FindMeshNode(nodeIn->children[i], meshNode, meshID)) {
            return true;
        }
    }

    return false;
}